

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

CompiledType * __thiscall
capnp::compiler::Compiler::ModuleScope::getRoot
          (CompiledType *__return_storage_ptr__,ModuleScope *this)

{
  Compiler *compiler;
  Reader source;
  ResolvedDecl *pRVar1;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *brand;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *other;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_368;
  Reader local_2b8;
  ResolvedDecl local_288;
  BrandedDecl local_228;
  undefined1 local_178 [8];
  ResolvedDecl decl;
  uint64_t local_110;
  undefined1 local_108 [8];
  Own<capnp::compiler::BrandScope,_std::nullptr_t> brandScope;
  undefined1 local_e0 [8];
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  undefined1 local_c8 [8];
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  ModuleScope *this_local;
  
  newDecl.value.source._reader._40_8_ = this;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8);
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e0,
             &this->compiler->impl);
  local_110 = Node::getId(this->node);
  decl.brand.ptr.field_1._44_4_ = 0;
  kj::
  refcounted<capnp::compiler::BrandScope,capnp::compiler::Compiler::ErrorIgnorer&,unsigned_long,int,capnp::compiler::Compiler::Node&>
            ((kj *)local_108,(ErrorIgnorer *)&ErrorIgnorer::instance,&local_110,
             (int *)((long)&decl.brand.ptr.field_1 + 0x2c),this->node);
  local_178 = (undefined1  [8])Node::getId(this->node);
  decl.id._0_4_ = 0;
  decl.genericParamCount = 0;
  decl._12_4_ = 0;
  decl.scopeId._0_2_ = Node::getKind(this->node);
  decl._24_8_ = this->node;
  kj::Maybe<capnp::schema::Brand::Reader>::Maybe
            ((Maybe<capnp::schema::Brand::Reader> *)&decl.resolver);
  pRVar1 = kj::mv<capnp::compiler::Resolver::ResolvedDecl>((ResolvedDecl *)local_178);
  Resolver::ResolvedDecl::ResolvedDecl(&local_288,pRVar1);
  brand = kj::mv<kj::Own<capnp::compiler::BrandScope,decltype(nullptr)>>
                    ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_108);
  local_2b8._reader.dataSize = 0;
  local_2b8._reader.pointerCount = 0;
  local_2b8._reader._38_2_ = 0;
  local_2b8._reader.nestingLimit = 0;
  local_2b8._reader._44_4_ = 0;
  local_2b8._reader.data = (void *)0x0;
  local_2b8._reader.pointers = (WirePointer *)0x0;
  local_2b8._reader.segment = (SegmentReader *)0x0;
  local_2b8._reader.capTable = (CapTableReader *)0x0;
  Expression::Reader::Reader(&local_2b8);
  source._reader.capTable = local_2b8._reader.capTable;
  source._reader.segment = local_2b8._reader.segment;
  source._reader.data = local_2b8._reader.data;
  source._reader.pointers = local_2b8._reader.pointers;
  source._reader.dataSize = local_2b8._reader.dataSize;
  source._reader.pointerCount = local_2b8._reader.pointerCount;
  source._reader._38_2_ = local_2b8._reader._38_2_;
  source._reader.nestingLimit = local_2b8._reader.nestingLimit;
  source._reader._44_4_ = local_2b8._reader._44_4_;
  BrandedDecl::BrandedDecl(&local_228,&local_288,brand,source);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
  set<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>>
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8,
             (Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e0,
             &local_228);
  BrandedDecl::~BrandedDecl(&local_228);
  Resolver::ResolvedDecl::~ResolvedDecl(&local_288);
  Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)local_178);
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
            ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_108);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e0);
  compiler = this->compiler;
  other = kj::mv<kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>>
                    ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded(&local_368,other);
  CompiledType::CompiledType(__return_storage_ptr__,compiler,&local_368);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_368);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Compiler::CompiledType Compiler::ModuleScope::getRoot() {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;

  {
    auto lock = compiler.impl.lockExclusive();
    auto brandScope = kj::refcounted<BrandScope>(ErrorIgnorer::instance, node.getId(), 0, node);
    Resolver::ResolvedDecl decl { node.getId(), 0, 0, node.getKind(), &node, kj::none };
    newDecl.set(lock, BrandedDecl(kj::mv(decl), kj::mv(brandScope), {}));
  }

  return CompiledType(compiler, kj::mv(newDecl));
}